

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Buffers::DataTest::TestCase
          (DataTest *this,offset_in_DataTest_to_subr UploadDataFunction,GLenum parameter)

{
  long *plVar1;
  ulong uVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  code *pcVar6;
  GLuint *reference;
  uint in_ECX;
  undefined4 in_register_00000014;
  ulong uVar7;
  bool bVar8;
  GLuint buffer;
  int local_38;
  uint local_34;
  long lVar5;
  
  local_34 = in_ECX;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  local_38 = 0;
  (**(code **)(lVar5 + 0x3b8))(1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x146);
  plVar1 = (long *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                   CONCAT44(in_register_00000014,parameter));
  pcVar6 = (code *)UploadDataFunction;
  if ((UploadDataFunction & 1) != 0) {
    pcVar6 = *(code **)(*plVar1 + -1 + UploadDataFunction);
  }
  (*pcVar6)(plVar1,local_38,local_34);
  (**(code **)(lVar5 + 0x40))(0x8892,local_38);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x14b);
  reference = (GLuint *)(**(code **)(lVar5 + 0xcf8))(0x8892,35000);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glMapBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x14e);
  if (*reference == 0) {
    uVar2 = 0;
    do {
      uVar7 = uVar2;
      if (uVar7 == 0xc) break;
      uVar2 = uVar7 + 1;
    } while (reference[uVar7 + 1] == *(GLuint *)(s_reference + uVar7 * 4 + 4));
    bVar8 = true;
    if (0xb < uVar7) goto LAB_00a860fd;
  }
  LogFail(this,UploadDataFunction,parameter,(GLuint *)(ulong)local_34,reference,0x1ac1c60);
  bVar8 = false;
LAB_00a860fd:
  (**(code **)(lVar5 + 0x1670))(0x8892);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glUnmapBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x158);
  if (local_38 != 0) {
    (**(code **)(lVar5 + 0x438))(1,&local_38);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glDeleteBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x165);
  }
  return bVar8;
}

Assistant:

bool DataTest::TestCase(void (DataTest::*UploadDataFunction)(glw::GLuint, glw::GLenum), glw::GLenum parameter)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint buffer   = 0;
	bool		is_ok	= true;
	bool		is_error = false;

	try
	{
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		(this->*UploadDataFunction)(buffer, parameter);

		gl.bindBuffer(GL_ARRAY_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer failed.");

		glw::GLuint* data = (glw::GLuint*)gl.mapBuffer(GL_ARRAY_BUFFER, GL_READ_ONLY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer failed.");

		is_ok = compare(data, s_reference, s_reference_count);

		if (!is_ok)
		{
			LogFail(UploadDataFunction, parameter, data, s_reference, s_reference_count);
		}

		gl.unmapBuffer(GL_ARRAY_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer failed.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;

		LogError(UploadDataFunction, parameter);
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
	}

	if (is_error)
	{
		throw 0;
	}

	return is_ok;
}